

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterInfo.hpp
# Opt level: O2

void __thiscall
helics::EptInformation::EptInformation
          (EptInformation *this,GlobalHandle gid,string_view key_,string_view type_)

{
  allocator<char> local_39;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_38._M_str = type_._M_str;
  local_38._M_len = type_._M_len;
  local_28._M_str = key_._M_str;
  local_28._M_len = key_._M_len;
  this->id = gid;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->key,&local_28,&local_39);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->type,&local_38,&local_39);
  return;
}

Assistant:

EptInformation(GlobalHandle gid, std::string_view key_, std::string_view type_):
        id(gid), key(key_), type(type_)
    {
    }